

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

uintwide_t<24U,_unsigned_char,_void,_false> * __thiscall
math::wide_integer::uintwide_t<8192U,_unsigned_int,_void,_false>::operator%=
          (uintwide_t<8192U,_unsigned_int,_void,_false> *this,
          uintwide_t<24U,_unsigned_char,_void,_false> *other)

{
  bool bVar1;
  bool bVar2;
  iterator first;
  iterator last;
  uintwide_t<24U,_unsigned_char,_void,_false> local_101c [2];
  uintwide_t<24U,_unsigned_char,_void,_false> remainder;
  uintwide_t<24U,_unsigned_char,_void,_false> local_c1c [2];
  local_unsigned_wide_type remainder_unsigned;
  uintwide_t<24U,_unsigned_char,_void,_false> local_81c [2];
  local_unsigned_wide_type b;
  uintwide_t<8192U,_unsigned_int,_void,_false> local_41c [8];
  local_unsigned_wide_type a;
  bool denom_was_neg;
  bool numer_was_neg;
  uintwide_t<24U,_unsigned_char,_void,_false> *other_local;
  uintwide_t<24U,_unsigned_char,_void,_false> *this_local;
  
  if (this == (uintwide_t<8192U,_unsigned_int,_void,_false> *)other) {
    first = detail::array_detail::array<unsigned_int,_256UL>::begin
                      ((array<unsigned_int,_256UL> *)this);
    last = detail::array_detail::array<unsigned_int,_256UL>::end((array<unsigned_int,_256UL> *)this)
    ;
    detail::fill_unsafe<unsigned_int*,unsigned_int>(first,last,0);
  }
  else {
    bVar1 = is_neg<false>((uintwide_t<24U,_unsigned_char,_void,_false> *)this,
                          (enable_if_t<(_false),_int> *)0x0);
    bVar2 = is_neg<false>(other,(enable_if_t<(_false),_int> *)0x0);
    if ((bVar1) || (bVar2)) {
      memcpy(local_41c,this,0x400);
      memcpy(local_81c,other,0x400);
      if (bVar1) {
        negate(local_41c);
      }
      if (bVar2) {
        negate((uintwide_t<8192U,_unsigned_int,_void,_false> *)local_81c);
      }
      memset(local_c1c,0,0x400);
      uintwide_t((uintwide_t<8192U,_unsigned_int,_void,_false> *)local_c1c);
      eval_divide_knuth(local_41c,local_81c,local_c1c);
      if (bVar1) {
        negate((uintwide_t<8192U,_unsigned_int,_void,_false> *)local_c1c);
      }
      memcpy(this,local_c1c,0x400);
    }
    else {
      memset(local_101c,0,0x400);
      uintwide_t((uintwide_t<8192U,_unsigned_int,_void,_false> *)local_101c);
      eval_divide_knuth(this,other,local_101c);
      memcpy(this,local_101c,0x400);
    }
  }
  return (uintwide_t<24U,_unsigned_char,_void,_false> *)this;
}

Assistant:

constexpr auto operator%=(const uintwide_t& other) -> uintwide_t&
    {
      if(this == &other)
      {
        detail::fill_unsafe(values.begin(), values.end(), static_cast<limb_type>(UINT8_C(0))); // LCOV_EXCL_LINE
      }
      else
      {
        // Unary modulus function.
        const auto numer_was_neg = is_neg(*this);
        const auto denom_was_neg = is_neg(other);

        if(numer_was_neg || denom_was_neg)
        {
          using local_unsigned_wide_type = uintwide_t<Width2, limb_type, AllocatorType, false>;

          local_unsigned_wide_type a(*this);
          local_unsigned_wide_type b(other);

          if(numer_was_neg) { a.negate(); }
          if(denom_was_neg) { b.negate(); }

          local_unsigned_wide_type remainder_unsigned { };

          a.eval_divide_knuth(b, &remainder_unsigned);

          // The sign of the remainder follows the sign of the denominator.
          if(numer_was_neg) { remainder_unsigned.negate(); }

          values = remainder_unsigned.values;
        }
        else
        {
          uintwide_t remainder { };

          eval_divide_knuth(other, &remainder);

          values = remainder.values;
        }
      }

      return *this;
    }